

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

void __thiscall google::anon_unknown_8::LogFileObject::~LogFileObject(LogFileObject *this)

{
  (this->super_Logger)._vptr_Logger = (_func_int **)&PTR__LogFileObject_0012d810;
  std::mutex::lock(&this->mutex_);
  std::__uniq_ptr_impl<_IO_FILE,_std::default_delete<_IO_FILE>_>::reset
            ((__uniq_ptr_impl<_IO_FILE,_std::default_delete<_IO_FILE>_> *)&this->file_,(pointer)0x0)
  ;
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
  std::unique_ptr<_IO_FILE,_std::default_delete<_IO_FILE>_>::~unique_ptr(&this->file_);
  std::__cxx11::string::~string((string *)&this->filename_extension_);
  std::__cxx11::string::~string((string *)&this->symlink_basename_);
  std::__cxx11::string::~string((string *)&this->base_filename_);
  return;
}

Assistant:

LogFileObject::~LogFileObject() {
  std::lock_guard<std::mutex> l{mutex_};
  file_ = nullptr;
}